

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

int Ver_ParseConnectDefBoxes(Ver_Man_t *pMan)

{
  ulong uVar1;
  undefined8 uVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *p_00;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkBox;
  long lVar3;
  int iVar4;
  int iVar5;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj;
  long *plVar6;
  char *pcVar7;
  void *pvVar8;
  char *pcVar9;
  undefined8 *puVar10;
  size_t sVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  Ver_Bundle_t *pVVar14;
  ulong uVar15;
  char *pcVar16;
  int iVar17;
  int i;
  uint uVar18;
  int i_00;
  uint uVar19;
  uint uVar20;
  int iVar21;
  char local_418 [1000];
  
  iVar17 = 1;
  i = 0;
  do {
    p = pMan->pDesign->vModules;
    if (p->nSize <= i) {
      return iVar17;
    }
    pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(p,i);
    for (i_00 = 0; i_00 < pNtk_00->vBoxes->nSize; i_00 = i_00 + 1) {
      pObj = Abc_NtkBox(pNtk_00,i_00);
      iVar5 = iVar17;
      if ((((*(uint *)&pObj->field_0x14 & 0xf) != 8) &&
          ((Abc_Ntk_t *)(pObj->field_5).pData != (Abc_Ntk_t *)0x0)) &&
         (iVar4 = Ver_NtkIsDefined((Abc_Ntk_t *)(pObj->field_5).pData), iVar5 = 2, iVar4 != 0)) {
        if ((*(uint *)&pObj->field_0x14 & 0xf) != 10 && (*(uint *)&pObj->field_0x14 & 0xe) != 8) {
          __assert_fail("Abc_ObjIsBox(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                        ,0x4e,"int Ver_ObjIsConnected(Abc_Obj_t *)");
        }
        if (((pObj->vFanins).nSize != 0) || ((pObj->vFanouts).nSize != 0)) {
          __assert_fail("!Ver_ObjIsConnected(pBox)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                        ,0x821,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
        }
        p_00 = (pObj->field_6).pCopy;
        pNtk = pObj->pNtk;
        pNtkBox = (Abc_Ntk_t *)(pObj->field_5).pData;
        iVar5 = Ver_NtkIsDefined(pNtkBox);
        if (iVar5 == 0) {
          __assert_fail("Ver_NtkIsDefined(pNtkBox)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                        ,0x822,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
        }
        if ((pNtkBox->ntkFunc == ABC_FUNC_BLACKBOX) && (pNtkBox->vBoxes->nSize != 1)) {
          __assert_fail("!Abc_NtkHasBlackbox(pNtkBox) || Abc_NtkBoxNum(pNtkBox) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                        ,0x823,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
        }
        uVar19 = *(int *)((long)&p_00->pNtk + 4);
        uVar20 = pNtkBox->vPos->nSize + pNtkBox->vPis->nSize;
        if ((int)uVar20 < (int)uVar19) {
          pcVar9 = pNtkBox->pName;
          pcVar7 = Abc_ObjName(pObj);
          sprintf(pMan->sError,
                  "The number of actual IOs (%d) is bigger than the number of formal IOs (%d) when instantiating network %s in box %s."
                  ,(ulong)uVar19,(ulong)uVar20,pcVar9,pcVar7);
          for (iVar17 = 0; iVar17 < *(int *)((long)&p_00->pNtk + 4); iVar17 = iVar17 + 1) {
            pVVar14 = (Ver_Bundle_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar17);
            Ver_ParseFreeBundle(pVVar14);
          }
LAB_002aec67:
          Vec_PtrFree((Vec_Ptr_t *)p_00);
          (pObj->field_6).pTemp = (void *)0x0;
LAB_002aeb0d:
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        for (iVar5 = 0; iVar5 < (int)uVar19; iVar5 = iVar5 + 1) {
          plVar6 = (long *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar5);
          uVar19 = *(int *)((long)&p_00->pNtk + 4);
          if (*plVar6 == 0) break;
        }
        if (iVar5 < (int)uVar19) {
          pcVar9 = pNtkBox->pName;
          pcVar7 = Abc_ObjName(pObj);
          printf("Warning: The instance %s of network %s will be connected without using formal names.\n"
                 ,pcVar9,pcVar7);
          uVar19 = 0;
          for (iVar5 = 0; uVar20 = *(int *)((long)&p_00->pNtk + 4), iVar5 < (int)uVar20;
              iVar5 = iVar5 + 1) {
            pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar5);
            uVar19 = uVar19 + *(int *)(*(long *)((long)pvVar8 + 8) + 4);
          }
          iVar5 = pNtkBox->vPis->nSize;
          uVar18 = pNtkBox->vPos->nSize + iVar5;
          if (uVar19 != uVar18) {
            pcVar9 = pNtkBox->pName;
            pcVar7 = Abc_ObjName(pObj);
            sprintf(pMan->sError,
                    "The number of actual IOs (%d) is different from the number of formal IOs (%d) when instantiating network %s in box %s."
                    ,(ulong)uVar20,(ulong)uVar18,pcVar9,pcVar7);
            for (iVar17 = 0; iVar17 < *(int *)((long)&p_00->pNtk + 4); iVar17 = iVar17 + 1) {
              pVVar14 = (Ver_Bundle_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar17);
              Ver_ParseFreeBundle(pVVar14);
            }
            goto LAB_002aec67;
          }
          iVar21 = 0;
          iVar4 = 0;
          while (iVar21 < iVar5) {
            Abc_NtkPi(pNtkBox,iVar21);
            pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar4);
            iVar5 = *(int *)(*(long *)((long)pvVar8 + 8) + 4);
            while (0 < iVar5) {
              iVar5 = iVar5 + -1;
              pAVar12 = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar8 + 8),iVar5);
              pAVar13 = Abc_NtkCreateBi(pNtk);
              Abc_ObjAddFanin(pObj,pAVar13);
              Abc_ObjAddFanin(pAVar13,pAVar12);
              iVar21 = iVar21 + 1;
            }
            iVar4 = iVar4 + 1;
            iVar5 = pNtkBox->vPis->nSize;
          }
          iVar5 = 0;
          while (iVar5 < pNtkBox->vPos->nSize) {
            Abc_NtkPo(pNtkBox,iVar5);
            pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar4);
            iVar21 = *(int *)(*(long *)((long)pvVar8 + 8) + 4);
            while (0 < iVar21) {
              iVar21 = iVar21 + -1;
              pAVar12 = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar8 + 8),iVar21);
              pAVar13 = Abc_NtkCreateBo(pNtk);
              Abc_ObjAddFanin(pAVar13,pObj);
              Abc_ObjAddFanin(pAVar12,pAVar13);
              iVar5 = iVar5 + 1;
            }
            iVar4 = iVar4 + 1;
          }
          for (iVar5 = 0; iVar5 < *(int *)((long)&p_00->pNtk + 4); iVar5 = iVar5 + 1) {
            pVVar14 = (Ver_Bundle_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar5);
            Ver_ParseFreeBundle(pVVar14);
          }
        }
        else {
          iVar5 = 0;
          while (iVar5 < pNtkBox->vPis->nSize) {
            pAVar12 = Abc_NtkPi(pNtkBox,iVar5);
            pcVar9 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanouts).pArray]);
            puVar10 = (undefined8 *)0x0;
            for (iVar4 = 0; iVar21 = *(int *)((long)&p_00->pNtk + 4), iVar4 < iVar21;
                iVar4 = iVar4 + 1) {
              puVar10 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar4);
              iVar21 = strcmp((char *)*puVar10,pcVar9);
              if (iVar21 == 0) {
                iVar21 = *(int *)((long)&p_00->pNtk + 4);
                goto LAB_002ae589;
              }
            }
            if (puVar10 == (undefined8 *)0x0) {
              __assert_fail("pBundle != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                            ,0x885,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
            }
LAB_002ae589:
            if (iVar21 == iVar4) {
              sVar11 = strlen(pcVar9);
              if (pcVar9[(long)((sVar11 << 0x20) + -0x100000000) >> 0x20] == ']') {
                uVar15 = sVar11 & 0xffffffff;
                do {
                  if ((int)uVar15 < 1) goto LAB_002aead4;
                  uVar1 = uVar15 - 1;
                  lVar3 = uVar15 - 1;
                  uVar15 = uVar1;
                } while (pcVar9[lVar3] != '[');
                if (uVar1 != 0) {
                  puVar10 = (undefined8 *)0x0;
                  for (iVar21 = 0; iVar21 < iVar4; iVar21 = iVar21 + 1) {
                    puVar10 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar21);
                    pcVar7 = (char *)*puVar10;
                    iVar4 = strncmp(pcVar7,pcVar9,uVar1 & 0xffffffff);
                    if ((iVar4 == 0) && (sVar11 = strlen(pcVar7), (int)sVar11 == (int)uVar1)) {
                      iVar4 = *(int *)((long)&p_00->pNtk + 4);
                      break;
                    }
                    iVar4 = *(int *)((long)&p_00->pNtk + 4);
                  }
                  if ((iVar4 != iVar21) && (puVar10 != (undefined8 *)0x0)) goto LAB_002ae65d;
                }
              }
LAB_002aead4:
              pcVar7 = pNtkBox->pName;
              pcVar16 = Abc_ObjName(pObj);
              sprintf(pMan->sError,
                      "Cannot find an actual net for the formal net %s when instantiating network %s in box %s."
                      ,pcVar9,pcVar7,pcVar16);
              goto LAB_002aeb0d;
            }
LAB_002ae65d:
            iVar4 = *(int *)(puVar10[1] + 4);
            while (0 < iVar4) {
              iVar4 = iVar4 + -1;
              pAVar12 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)puVar10[1],iVar4);
              pAVar13 = Abc_NtkCreateBi(pNtk);
              Abc_ObjAddFanin(pObj,pAVar13);
              Abc_ObjAddFanin(pAVar13,pAVar12);
              iVar5 = iVar5 + 1;
            }
          }
          iVar5 = 0;
          while (iVar5 < pNtkBox->vPos->nSize) {
            pAVar12 = Abc_NtkPo(pNtkBox,iVar5);
            pcVar9 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanins).pArray]);
            puVar10 = (undefined8 *)0x0;
            for (iVar4 = 0; iVar21 = *(int *)((long)&p_00->pNtk + 4), iVar4 < iVar21;
                iVar4 = iVar4 + 1) {
              puVar10 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar4);
              iVar21 = strcmp((char *)*puVar10,pcVar9);
              if (iVar21 == 0) {
                iVar21 = *(int *)((long)&p_00->pNtk + 4);
                goto LAB_002ae884;
              }
            }
            if (puVar10 == (undefined8 *)0x0) {
              __assert_fail("pBundle != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                            ,0x8b8,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
            }
LAB_002ae884:
            if (iVar21 == iVar4) {
              sVar11 = strlen(pcVar9);
              if (pcVar9[(long)((sVar11 << 0x20) + -0x100000000) >> 0x20] == ']') {
                uVar15 = sVar11 & 0xffffffff;
                do {
                  if ((int)uVar15 < 1) goto LAB_002ae944;
                  uVar1 = uVar15 - 1;
                  lVar3 = uVar15 - 1;
                  uVar15 = uVar1;
                } while (pcVar9[lVar3] != '[');
                if (uVar1 != 0) {
                  puVar10 = (undefined8 *)0x0;
                  for (iVar21 = 0; iVar21 < iVar4; iVar21 = iVar21 + 1) {
                    puVar10 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar21);
                    pcVar7 = (char *)*puVar10;
                    iVar4 = strncmp(pcVar7,pcVar9,uVar1 & 0xffffffff);
                    if ((iVar4 == 0) && (sVar11 = strlen(pcVar7), (int)sVar11 == (int)uVar1)) {
                      iVar4 = *(int *)((long)&p_00->pNtk + 4);
                      break;
                    }
                    iVar4 = *(int *)((long)&p_00->pNtk + 4);
                  }
                  if (iVar4 != iVar21 && puVar10 != (undefined8 *)0x0) goto LAB_002ae997;
                }
              }
LAB_002ae944:
              pAVar12 = Abc_NtkCreateBo(pNtk);
              sprintf(local_418,"_temp_net%d",(ulong)(uint)pAVar12->Id);
              pAVar13 = Abc_NtkFindOrCreateNet(pNtk,local_418);
              Abc_ObjAddFanin(pAVar12,pObj);
              Abc_ObjAddFanin(pAVar13,pAVar12);
              iVar5 = iVar5 + 1;
            }
            else {
LAB_002ae997:
              iVar4 = *(int *)(puVar10[1] + 4);
              while (0 < iVar4) {
                pAVar12 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)puVar10[1],iVar4 + -1);
                pcVar9 = Abc_ObjName(pAVar12);
                iVar21 = strcmp(pcVar9,"1\'b0");
                if (iVar21 == 0) {
LAB_002aeb2b:
                  uVar2 = *puVar10;
                  pcVar7 = Abc_ObjName(pAVar12);
                  pcVar9 = pNtkBox->pName;
                  pcVar16 = Abc_ObjName(pObj);
                  sprintf(pMan->sError,
                          "It looks like formal output %s is driving a constant net (%s) when instantiating network %s in box %s."
                          ,uVar2,pcVar7,pcVar9,pcVar16);
                  for (iVar17 = 0; iVar17 < *(int *)((long)&p_00->pNtk + 4); iVar17 = iVar17 + 1) {
                    pVVar14 = (Ver_Bundle_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar17);
                    Ver_ParseFreeBundle(pVVar14);
                  }
                  Vec_PtrFree((Vec_Ptr_t *)p_00);
                  (pObj->field_6).pTemp = (void *)0x0;
                  goto LAB_002aeb0d;
                }
                pcVar9 = Abc_ObjName(pAVar12);
                iVar21 = strcmp(pcVar9,"1\'b1");
                if (iVar21 == 0) goto LAB_002aeb2b;
                pAVar13 = Abc_NtkCreateBo(pNtk);
                Abc_ObjAddFanin(pAVar13,pObj);
                Abc_ObjAddFanin(pAVar12,pAVar13);
                iVar5 = iVar5 + 1;
                iVar4 = iVar4 + -1;
              }
            }
          }
          for (iVar5 = 0; iVar5 < *(int *)((long)&p_00->pNtk + 4); iVar5 = iVar5 + 1) {
            pVVar14 = (Ver_Bundle_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar5);
            Ver_ParseFreeBundle(pVVar14);
          }
        }
        Vec_PtrFree((Vec_Ptr_t *)p_00);
        (pObj->field_6).pTemp = (void *)0x0;
        iVar5 = iVar17;
        if (*(int *)((long)(pObj->field_5).pData + 4) != 6) {
          if ((*(uint *)&pObj->field_0x14 & 0xf) != 10) {
            __assert_fail("Abc_ObjIsBlackbox(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                          ,0x16a,"void Abc_ObjBlackboxToWhitebox(Abc_Obj_t *)");
          }
          *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfffffff0 | 9;
          uVar2 = *(undefined8 *)(pObj->pNtk->nObjCounts + 9);
          *(ulong *)(pObj->pNtk->nObjCounts + 9) =
               CONCAT44((int)((ulong)uVar2 >> 0x20) + -1,(int)uVar2 + 1);
        }
      }
      iVar17 = iVar5;
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Ver_ParseConnectDefBoxes( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, RetValue = 1;
    // go through all the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        // go through all the boxes of this module
        Abc_NtkForEachBox( pNtk, pBox, k )
        {
            if ( Abc_ObjIsLatch(pBox) )
                continue;
            // skip internal boxes of the blackboxes
            if ( pBox->pData == NULL )
                continue;
            // if the network is undefined, it will be connected later
            if ( !Ver_NtkIsDefined((Abc_Ntk_t *)pBox->pData) )
            {
                RetValue = 2;
                continue;
            }
            // connect the box
            if ( !Ver_ParseConnectBox( pMan, pBox ) )
                return 0;
            // if the network is a true blackbox, skip
            if ( Abc_NtkHasBlackbox((Abc_Ntk_t *)pBox->pData) )
                continue;
            // convert the box to the whitebox
            Abc_ObjBlackboxToWhitebox( pBox );
        }
    }
    return RetValue;
}